

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

void xmlSchemaCleanupTypesInternal(void)

{
  xmlSchemaTypePtr pxVar1;
  long lVar2;
  
  if (xmlSchemaTypeAnyTypeDef != (xmlSchemaTypePtr)0x0) {
    xmlSchemaFreeWildcard(xmlSchemaTypeAnyTypeDef->attributeWildcard);
    pxVar1 = xmlSchemaTypeAnyTypeDef->subtypes;
    if (pxVar1 != (xmlSchemaTypePtr)0x0) {
      if (pxVar1->id != (xmlChar *)0x0) {
        lVar2 = *(long *)(pxVar1->id + 0x18);
        if (lVar2 != 0) {
          xmlSchemaFreeWildcard(*(xmlSchemaWildcardPtr *)(lVar2 + 0x18));
          (*xmlFree)(*(void **)(pxVar1->id + 0x18));
        }
        (*xmlFree)(pxVar1->id);
      }
      (*xmlFree)(pxVar1);
    }
    xmlSchemaTypeAnyTypeDef->subtypes = (xmlSchemaTypePtr)0x0;
    xmlSchemaTypeAnyTypeDef = (xmlSchemaTypePtr)0x0;
  }
  xmlHashFree(xmlSchemaTypesBank,xmlSchemaFreeTypeEntry);
  xmlSchemaTypesBank = (xmlHashTablePtr)0x0;
  return;
}

Assistant:

static void
xmlSchemaCleanupTypesInternal(void) {
    xmlSchemaParticlePtr particle;

    /*
    * Free xs:anyType.
    */
    if (xmlSchemaTypeAnyTypeDef != NULL) {
        /* Attribute wildcard. */
        xmlSchemaFreeWildcard(xmlSchemaTypeAnyTypeDef->attributeWildcard);
        /* Content type. */
        particle = (xmlSchemaParticlePtr) xmlSchemaTypeAnyTypeDef->subtypes;
        if (particle != NULL) {
            if (particle->children != NULL) {
                if (particle->children->children != NULL) {
                    /* Wildcard. */
                    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)
                        particle->children->children->children);
                    xmlFree((xmlSchemaParticlePtr)
                        particle->children->children);
                }
                /* Sequence model group. */
                xmlFree((xmlSchemaModelGroupPtr) particle->children);
            }
            xmlFree((xmlSchemaParticlePtr) particle);
        }
        xmlSchemaTypeAnyTypeDef->subtypes = NULL;
        xmlSchemaTypeAnyTypeDef = NULL;
    }

    xmlHashFree(xmlSchemaTypesBank, xmlSchemaFreeTypeEntry);
    xmlSchemaTypesBank = NULL;
    /* Note that the xmlSchemaType*Def pointers aren't set to NULL. */
}